

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

bool __thiscall QObject::event(QObject *this,QEvent *e)

{
  bool bVar1;
  Type TVar2;
  int iVar3;
  QObject *sender_00;
  Type pQVar4;
  QAbstractMetaCallEvent *in_RSI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  bool res;
  QAbstractEventDispatcher *eventDispatcher;
  QThreadData *threadData;
  QObjectPrivate *d;
  ConnectionData *connections;
  QAbstractMetaCallEvent *mce;
  anon_class_32_2_54c7b1c9_for_o reRegisterTimers;
  QList<QAbstractEventDispatcher::TimerInfoV2> timers;
  Sender sender;
  QMutexLocker<QBasicMutex> locker;
  QList<QAbstractEventDispatcher::TimerInfoV2> *in_stack_ffffffffffffff08;
  Sender *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff1c;
  ConnectionType type;
  QObjectPrivate *in_stack_ffffffffffffff20;
  ConnectionData *local_a0;
  bool local_79;
  QObject *in_stack_ffffffffffffffa0;
  QAbstractEventDispatcher *in_stack_ffffffffffffffa8;
  undefined1 local_38 [32];
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  TVar2 = QEvent::type(&in_RSI->super_QEvent);
  if (TVar2 == Timer) {
    (*in_RDI->_vptr_QObject[7])(in_RDI,in_RSI);
  }
  else if (TVar2 == ThreadChange) {
    d_func((QObject *)0x3ed963);
    QBasicAtomicPointer<QThreadData>::loadRelaxed((QBasicAtomicPointer<QThreadData> *)0x3ed976);
    pQVar4 = QBasicAtomicPointer<QAbstractEventDispatcher>::loadRelaxed
                       ((QBasicAtomicPointer<QAbstractEventDispatcher> *)0x3ed989);
    if (pQVar4 != (Type)0x0) {
      QAbstractEventDispatcher::timersForObject(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0)
      ;
      bVar1 = QList<QAbstractEventDispatcher::TimerInfoV2>::isEmpty
                        ((QList<QAbstractEventDispatcher::TimerInfoV2> *)0x3ed9eb);
      if (!bVar1) {
        iVar3 = (*(pQVar4->super_QObject)._vptr_QObject[0x11])(pQVar4,in_RDI);
        type = CONCAT13((char)iVar3,(int3)in_stack_ffffffffffffff1c);
        QList<QAbstractEventDispatcher::TimerInfoV2>::QList
                  ((QList<QAbstractEventDispatcher::TimerInfoV2> *)in_stack_ffffffffffffff10,
                   in_stack_ffffffffffffff08);
        QMetaObject::invokeMethod<QObject::event(QEvent*)::__0>
                  (in_RDI,(anon_class_32_2_54c7b1c9_for_o *)in_stack_ffffffffffffff20,type);
        event(QEvent*)::$_0::~__0((anon_class_32_2_54c7b1c9_for_o *)0x3eda80);
      }
      QList<QAbstractEventDispatcher::TimerInfoV2>::~QList
                ((QList<QAbstractEventDispatcher::TimerInfoV2> *)0x3edac4);
    }
  }
  else if (TVar2 == MetaCall) {
    d_func((QObject *)0x3ed811);
    local_a0 = QBasicAtomicPointer<QObjectPrivate::ConnectionData>::loadAcquire
                         ((QBasicAtomicPointer<QObjectPrivate::ConnectionData> *)0x3ed81d);
    if (local_a0 == (Type)0x0) {
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
      signalSlotLock(in_RDI);
      QMutexLocker<QBasicMutex>::QMutexLocker
                ((QMutexLocker<QBasicMutex> *)in_stack_ffffffffffffff10,
                 (QBasicMutex *)in_stack_ffffffffffffff08);
      d_func((QObject *)0x3ed861);
      QObjectPrivate::ensureConnectionData(in_stack_ffffffffffffff20);
      d_func((QObject *)0x3ed875);
      local_a0 = QBasicAtomicPointer<QObjectPrivate::ConnectionData>::loadRelaxed
                           ((QBasicAtomicPointer<QObjectPrivate::ConnectionData> *)0x3ed881);
      QMutexLocker<QBasicMutex>::~QMutexLocker
                ((QMutexLocker<QBasicMutex> *)in_stack_ffffffffffffff10);
    }
    local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    sender_00 = QAbstractMetaCallEvent::sender(in_RSI);
    iVar3 = QAbstractMetaCallEvent::signalId(in_RSI);
    QObjectPrivate::Sender::Sender((Sender *)local_38,in_RDI,sender_00,iVar3,local_a0);
    (*(in_RSI->super_QEvent)._vptr_QEvent[4])(in_RSI,in_RDI);
    QObjectPrivate::Sender::~Sender(in_stack_ffffffffffffff10);
  }
  else if (TVar2 == DeferredDelete) {
    if (in_RDI != (QObject *)0x0) {
      (*in_RDI->_vptr_QObject[4])();
    }
  }
  else if ((TVar2 - ChildAdded < 2) || (TVar2 == ChildRemoved)) {
    (*in_RDI->_vptr_QObject[8])(in_RDI,in_RSI);
  }
  else {
    TVar2 = QEvent::type(&in_RSI->super_QEvent);
    if ((int)TVar2 < 1000) {
      local_79 = false;
      goto LAB_003edb06;
    }
    (*in_RDI->_vptr_QObject[9])(in_RDI,in_RSI);
  }
  local_79 = true;
LAB_003edb06:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_79;
}

Assistant:

bool QObject::event(QEvent *e)
{
    switch (e->type()) {
    case QEvent::Timer:
        timerEvent((QTimerEvent *)e);
        break;

    case QEvent::ChildAdded:
    case QEvent::ChildPolished:
    case QEvent::ChildRemoved:
        childEvent((QChildEvent *)e);
        break;

    case QEvent::DeferredDelete:
        delete this;
        break;

    case QEvent::MetaCall:
        {
            QAbstractMetaCallEvent *mce = static_cast<QAbstractMetaCallEvent*>(e);

            QObjectPrivate::ConnectionData *connections = d_func()->connections.loadAcquire();
            if (!connections) {
                QMutexLocker locker(signalSlotLock(this));
                d_func()->ensureConnectionData();
                connections = d_func()->connections.loadRelaxed();
            }
            QObjectPrivate::Sender sender(this, const_cast<QObject*>(mce->sender()), mce->signalId(), connections);

            mce->placeMetaCall(this);
            break;
        }

    case QEvent::ThreadChange: {
        Q_D(QObject);
        QThreadData *threadData = d->threadData.loadRelaxed();
        QAbstractEventDispatcher *eventDispatcher = threadData->eventDispatcher.loadRelaxed();
        if (eventDispatcher) {
            QList<QAbstractEventDispatcher::TimerInfoV2> timers = eventDispatcher->timersForObject(this);
            if (!timers.isEmpty()) {
                const bool res = eventDispatcher->unregisterTimers(this);
                // do not to release our timer ids back to the pool (since the timer ids are moving to a new thread).
                Q_ASSERT_X(res, Q_FUNC_INFO,
                           "QAbstractEventDispatcher::unregisterTimers() returned false,"
                           " but there are timers associated with this object.");
                auto reRegisterTimers = [this, timers = std::move(timers)]() {
                    QAbstractEventDispatcher *eventDispatcher =
                            d_func()->threadData.loadRelaxed()->eventDispatcher.loadRelaxed();
                    for (const auto &ti : timers)
                        eventDispatcher->registerTimer(ti.timerId, ti.interval, ti.timerType, this);
                };
                QMetaObject::invokeMethod(this, std::move(reRegisterTimers), Qt::QueuedConnection);
            }
        }
        break;
    }

    default:
        if (e->type() >= QEvent::User) {
            customEvent(e);
            break;
        }
        return false;
    }
    return true;
}